

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testExistingStreams.cpp
# Opt level: O1

void __thiscall anon_unknown.dwarf_156c2f::MMIFStream::~MMIFStream(MMIFStream *this)

{
  ~MMIFStream(this);
  operator_delete(this,0x50);
  return;
}

Assistant:

MMIFStream::~MMIFStream ()
{
#ifdef _WIN32
    if (_mmapStart) { UnmapViewOfFile ((void*) _mmapStart); }
    if (_mmap) { CloseHandle (_mmap); }
    if (_f != INVALID_HANDLE_VALUE) { CloseHandle (_f); }

#else

    if (_mmap != (void*) -1) { munmap (_mmap, _length); }
    if (_f != -1) { close (_f); }
#endif
}